

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_use.cpp
# Opt level: O3

unique_ptr<duckdb::SetStatement,_std::default_delete<duckdb::SetStatement>,_true> __thiscall
duckdb::Transformer::TransformUse(Transformer *this,PGUseStmt *stmt)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> **pp_Var2;
  bool bVar3;
  long *plVar4;
  Transformer *pTVar5;
  ConstantExpression *this_00;
  ParserException *this_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  long in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  undefined8 uVar8;
  string name;
  QualifiedName qualified_name;
  Value local_190;
  _Alloc_hider local_150;
  size_type local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  undefined1 local_130 [32];
  Value local_110;
  bool *local_d0;
  long local_c8;
  bool local_c0 [16];
  string local_b0;
  QualifiedName local_90;
  
  TransformQualifiedName(&local_90,(Transformer *)stmt,*(PGRangeVar **)(in_RDX + 8));
  bVar3 = IsInvalidCatalog(&local_90.catalog);
  if (!bVar3) {
    this_01 = (ParserException *)__cxa_allocate_exception(0x10);
    local_190.type_._0_8_ =
         &local_190.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_190,"Expected \"USE database\" or \"USE database.schema\"","");
    ParserException::ParserException(this_01,(string *)&local_190);
    __cxa_throw(this_01,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
  }
  local_c8 = 0;
  local_c0[0] = false;
  local_d0 = local_c0;
  bVar3 = IsInvalidSchema(&local_90.schema);
  if (bVar3) {
    KeywordHelper::WriteOptionallyQuoted((string *)&local_190,&local_90.name,'\"',true);
    ::std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_190);
    pTVar5 = (Transformer *)
             &local_190.type_.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_130._0_8_ = local_190.type_._0_8_;
    goto LAB_01276ae6;
  }
  KeywordHelper::WriteOptionallyQuoted((string *)local_130,&local_90.schema,'\"',true);
  plVar4 = (long *)::std::__cxx11::string::append(local_130);
  pp_Var2 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)
            &local_110.type_.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  p_Var6 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(plVar4 + 2);
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)*plVar4 == p_Var6) {
    local_110.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         p_Var6->_M_pi;
    local_110._24_8_ = plVar4[3];
    local_110.type_._0_8_ = pp_Var2;
  }
  else {
    local_110.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         p_Var6->_M_pi;
    local_110.type_._0_8_ = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)*plVar4;
  }
  local_110.type_.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)plVar4[1];
  *plVar4 = (long)p_Var6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  KeywordHelper::WriteOptionallyQuoted((string *)&local_150,&local_90.name,'\"',true);
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ((long)&(local_110.type_.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   _vptr_ExtraTypeInfo + local_148);
  _Var7._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf;
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> **)local_110.type_._0_8_ != pp_Var2) {
    _Var7._M_pi = local_110.type_.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
  }
  if (_Var7._M_pi < p_Var1) {
    uVar8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf;
    if ((string *)local_150._M_p != (string *)&local_140) {
      uVar8 = local_140._M_allocated_capacity;
    }
    if ((ulong)uVar8 < p_Var1) goto LAB_01276a2d;
    plVar4 = (long *)::std::__cxx11::string::replace
                               ((ulong)&local_150,0,(char *)0x0,local_110.type_._0_8_);
  }
  else {
LAB_01276a2d:
    plVar4 = (long *)::std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_150._M_p);
  }
  local_190.type_._0_8_ =
       &local_190.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  pTVar5 = (Transformer *)(plVar4 + 2);
  if ((Transformer *)*plVar4 == pTVar5) {
    local_190.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(pTVar5->parent).ptr;
    local_190._24_8_ = plVar4[3];
  }
  else {
    local_190.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(pTVar5->parent).ptr;
    local_190.type_._0_8_ = (Transformer *)*plVar4;
  }
  local_190.type_.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)plVar4[1];
  *plVar4 = (long)pTVar5;
  plVar4[1] = 0;
  *(undefined1 *)&(pTVar5->parent).ptr = 0;
  ::std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_190);
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_190.type_._0_8_ !=
      &local_190.type_.type_info_.internal.
       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
    operator_delete((void *)local_190.type_._0_8_);
  }
  if ((string *)local_150._M_p != (string *)&local_140) {
    operator_delete(local_150._M_p);
  }
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> **)local_110.type_._0_8_ != pp_Var2) {
    operator_delete((void *)local_110.type_._0_8_);
  }
  pTVar5 = (Transformer *)(local_130 + 0x10);
LAB_01276ae6:
  if ((Transformer *)local_130._0_8_ != pTVar5) {
    operator_delete((void *)local_130._0_8_);
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  ::std::__cxx11::string::_M_construct<char*>((string *)&local_b0,local_d0,local_d0 + local_c8);
  Value::Value(&local_110,&local_b0);
  this_00 = (ConstantExpression *)operator_new(0x78);
  Value::Value(&local_190,&local_110);
  ConstantExpression::ConstantExpression(this_00,&local_190);
  local_130._0_8_ = this_00;
  Value::~Value(&local_190);
  Value::~Value(&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  local_110.type_._0_8_ = local_110.type_._0_8_ & 0xffffffffffffff00;
  make_uniq<duckdb::SetVariableStatement,char_const(&)[7],duckdb::unique_ptr<duckdb::ConstantExpression,std::default_delete<duckdb::ConstantExpression>,true>,duckdb::SetScope>
            ((duckdb *)&local_190,(char (*) [7])0x1da9b7a,
             (unique_ptr<duckdb::ConstantExpression,_std::default_delete<duckdb::ConstantExpression>,_true>
              *)local_130,(SetScope *)&local_110);
  (this->parent).ptr = (Transformer *)local_190.type_._0_8_;
  if ((ConstantExpression *)local_130._0_8_ != (ConstantExpression *)0x0) {
    (**(code **)(*(long *)local_130._0_8_ + 8))();
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.name._M_dataplus._M_p != &local_90.name.field_2) {
    operator_delete(local_90.name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.schema._M_dataplus._M_p != &local_90.schema.field_2) {
    operator_delete(local_90.schema._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.catalog._M_dataplus._M_p != &local_90.catalog.field_2) {
    operator_delete(local_90.catalog._M_dataplus._M_p);
  }
  return (unique_ptr<duckdb::SetStatement,_std::default_delete<duckdb::SetStatement>_>)
         (unique_ptr<duckdb::SetStatement,_std::default_delete<duckdb::SetStatement>_>)this;
}

Assistant:

unique_ptr<SetStatement> Transformer::TransformUse(duckdb_libpgquery::PGUseStmt &stmt) {
	auto qualified_name = TransformQualifiedName(*stmt.name);
	if (!IsInvalidCatalog(qualified_name.catalog)) {
		throw ParserException("Expected \"USE database\" or \"USE database.schema\"");
	}
	string name;
	if (IsInvalidSchema(qualified_name.schema)) {
		name = KeywordHelper::WriteOptionallyQuoted(qualified_name.name, '"');
	} else {
		name = KeywordHelper::WriteOptionallyQuoted(qualified_name.schema, '"') + "." +
		       KeywordHelper::WriteOptionallyQuoted(qualified_name.name, '"');
	}
	auto name_expr = make_uniq<ConstantExpression>(Value(name));
	return make_uniq<SetVariableStatement>("schema", std::move(name_expr), SetScope::AUTOMATIC);
}